

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::TextLabel::minimumSizeHint(TextLabel *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  TextLabelPrivate *pTVar8;
  qreal qVar9;
  qreal qVar10;
  undefined1 auVar11 [16];
  undefined1 auStack_a8 [4];
  int frame;
  QSizeF size;
  QTextOption local_90 [24];
  QString local_78;
  undefined1 local_60 [8];
  QTextDocument doc;
  undefined1 local_4c [8];
  QMargins margins;
  QString local_30;
  TextLabel *local_18;
  TextLabel *this_local;
  
  local_18 = this;
  text(&local_30,this);
  bVar1 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  if (bVar1) {
    iVar2 = QFrame::frameWidth();
    iVar3 = QFrame::frameWidth();
    QSize::QSize((QSize *)&this_local,iVar2 << 1,iVar3 << 1);
  }
  else {
    auVar11 = QWidget::contentsMargins();
    margins._0_8_ = auVar11._8_8_;
    local_4c = auVar11._0_8_;
    QTextDocument::QTextDocument((QTextDocument *)local_60,(QObject *)0x0);
    QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
    ::operator->(&this->d);
    QStaticText::text();
    QTextDocument::setHtml((QString *)local_60);
    QString::~QString(&local_78);
    QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
    ::operator->(&this->d);
    QStaticText::textOption();
    QTextDocument::setDefaultTextOption((QTextOption *)local_60);
    QTextOption::~QTextOption(local_90);
    QWidget::fontMetrics((QWidget *)&size.ht);
    iVar2 = QFontMetrics::averageCharWidth();
    QTextDocument::setTextWidth((double)(iVar2 * 10));
    QFontMetrics::~QFontMetrics((QFontMetrics *)&size.ht);
    _auStack_a8 = (qreal)QTextDocument::size();
    iVar3 = QFrame::frameWidth();
    qVar9 = QSizeF::width((QSizeF *)auStack_a8);
    iVar4 = QMargins::left((QMargins *)local_4c);
    iVar5 = QMargins::right((QMargins *)local_4c);
    pTVar8 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    iVar2 = pTVar8->margin;
    qVar10 = QSizeF::height((QSizeF *)auStack_a8);
    iVar6 = QMargins::top((QMargins *)local_4c);
    iVar7 = QMargins::bottom((QMargins *)local_4c);
    pTVar8 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    QSize::QSize((QSize *)&this_local,
                 (int)(qVar9 + (double)(iVar3 << 1) + (double)iVar4 + (double)iVar5 +
                      (double)(iVar2 << 1)),
                 (int)(qVar10 + (double)(iVar3 << 1) + (double)iVar6 + (double)iVar7 +
                      (double)(pTVar8->margin << 1)));
    QTextDocument::~QTextDocument((QTextDocument *)local_60);
  }
  return (QSize)this_local;
}

Assistant:

QSize
TextLabel::minimumSizeHint() const
{
	if( text().isEmpty() )
		return QSize( 2 * frameWidth(), 2 * frameWidth() );

	const QMargins margins = contentsMargins();

	QTextDocument doc;
	doc.setHtml( d->staticText.text() );
	doc.setDefaultTextOption( d->staticText.textOption() );
	doc.setTextWidth( fontMetrics().averageCharWidth() * 10 );

	const QSizeF size = doc.size();
	const int frame = 2 * frameWidth();

	return QSize( size.width() + frame + margins.left() + margins.right() +
		2 * d->margin,
		size.height() + frame + margins.top() + margins.bottom() +
		2 * d->margin );
}